

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

int Tas_ManResolve(Tas_Man_t *p,int Level,int hClause0,int hClause1)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Tas_Que_t *p_00;
  int local_38;
  int LevelCur;
  int LevelMax;
  int i;
  Gia_Obj_t *pObj;
  Tas_Que_t *pQue;
  int hClause1_local;
  int hClause0_local;
  int Level_local;
  Tas_Man_t *p_local;
  
  p_00 = &p->pClauses;
  local_38 = -1;
  if ((p->pClauses).pData[hClause0] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[hClause0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x36e,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  if ((p->pClauses).pData[hClause0] != (p->pClauses).pData[hClause1]) {
    __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x36f,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  iVar2 = Tas_QueIsEmpty(p_00);
  if (iVar2 == 0) {
    __assert_fail("Tas_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x376,"int Tas_ManResolve(Tas_Man_t *, int, int, int)");
  }
  Tas_QuePush(p_00,(Gia_Obj_t *)0x0);
  for (LevelCur = hClause0 + 1; pGVar1 = (p->pClauses).pData[LevelCur], pGVar1 != (Gia_Obj_t *)0x0;
      LevelCur = LevelCur + 1) {
    if (-1 < *(long *)pGVar1) {
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff | 0x8000000000000000;
      Tas_QuePush(p_00,pGVar1);
      iVar2 = Tas_VarDecLevel(p,pGVar1);
      if (local_38 < iVar2) {
        local_38 = iVar2;
      }
    }
  }
  for (LevelCur = hClause1 + 1; pGVar1 = (p->pClauses).pData[LevelCur], pGVar1 != (Gia_Obj_t *)0x0;
      LevelCur = LevelCur + 1) {
    if (-1 < *(long *)pGVar1) {
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff | 0x8000000000000000;
      Tas_QuePush(p_00,pGVar1);
      iVar2 = Tas_VarDecLevel(p,pGVar1);
      if (local_38 < iVar2) {
        local_38 = iVar2;
      }
    }
  }
  LevelCur = p_00->iHead;
  while (LevelCur = LevelCur + 1, LevelCur < (p->pClauses).iTail) {
    pGVar1 = (p->pClauses).pData[LevelCur];
    *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff;
  }
  Tas_ManDeriveReason(p,local_38);
  iVar2 = Tas_QueFinish(p_00);
  return iVar2;
}

Assistant:

static inline int Tas_ManResolve( Tas_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj;
    int i, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0] != NULL );
    assert( pQue->pData[hClause0] == pQue->pData[hClause1] );
/*
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fPhase == 0 );
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fPhase == 0 );
*/
    assert( Tas_QueIsEmpty( pQue ) );
    Tas_QuePush( pQue, NULL );
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Tas_QuePush( pQue, pObj );
        LevelCur = Tas_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Tas_QuePush( pQue, pObj );
        LevelCur = Tas_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
        pQue->pData[i]->fPhase = 0;
    Tas_ManDeriveReason( p, LevelMax );
    return Tas_QueFinish( pQue );
}